

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          FixedArray<char,_1UL> *params_7)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long local_70;
  char *apcStack_68 [2];
  size_t local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  undefined8 local_38;
  
  local_70 = *(long *)(this + 8);
  apcStack_68[0] = params->ptr;
  apcStack_68[1] = (char *)*(undefined8 *)params_1->content;
  local_58 = params_2->size_;
  local_50 = params_3->size_;
  local_48 = params_4->size_;
  local_40 = params_5->size_;
  local_38 = 1;
  lVar3 = 0;
  pcVar4 = (char *)0x0;
  lVar1 = 0;
  do {
    lVar3 = lVar3 + (&local_70)[lVar1];
    pcVar4 = pcVar4 + (long)apcStack_68[lVar1];
    lVar1 = lVar1 + 2;
  } while (lVar1 != 8);
  heapString(__return_storage_ptr__,(size_t)(pcVar4 + lVar3));
  pcVar4 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->content).ptr;
  }
  lVar1 = *(long *)(this + 8);
  if (lVar1 != 0) {
    lVar3 = *(long *)this;
    lVar2 = 0;
    do {
      pcVar4[lVar2] = *(char *)(lVar3 + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    pcVar4 = pcVar4 + lVar2;
  }
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (pcVar4,(CappedArray<char,_14UL> *)params,(ArrayPtr<const_char> *)params_1,params_2,
             params_3,params_4,params_5,(FixedArray<char,_1UL> *)params_6);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}